

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

bool __thiscall Matrix<int>::operator!=(Matrix<int> *this,Matrix<int> *op2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = (ulong)this->n;
  if (0 < (long)uVar1) {
    uVar3 = 0;
    bVar4 = false;
    do {
      if (0 < this->m) {
        uVar2 = 0;
        do {
          if (this->M[uVar3][uVar2] == op2->M[uVar3][uVar2]) {
            return bVar4;
          }
          uVar2 = uVar2 + 1;
        } while ((uint)this->m != uVar2);
      }
      uVar3 = uVar3 + 1;
      bVar4 = uVar1 <= uVar3;
    } while (uVar3 != uVar1);
  }
  return true;
}

Assistant:

bool operator!=(const Matrix<T>& op2) const {
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        if (M[i][j] == op2.M[i][j]) {
          return false;
        }
      }
    }
    return true;
  }